

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::NameResolver::BeginLoopExpr(NameResolver *this,LoopExpr *expr)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->block).label);
  if ((expr->block).decl.has_func_type == true) {
    ResolveVar(this,&this->current_module_->type_bindings,&(expr->block).decl.type_var,"type");
  }
  return (Result)Ok;
}

Assistant:

Result NameResolver::BeginLoopExpr(LoopExpr* expr) {
  PushLabel(expr->block.label);
  ResolveBlockDeclarationVar(&expr->block.decl);
  return Result::Ok;
}